

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O3

void __thiscall
dg::pta::LLVMPointerGraphBuilder::PSNodesBlock::append(PSNodesBlock *this,PSNodesSeq *s)

{
  pointer *pppPVar1;
  iterator __position;
  PSNodesSeq *local_8;
  
  __position._M_current =
       (this->_nodes).
       super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_nodes).
      super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = s;
    std::
    vector<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq*,std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq*>>
    ::_M_realloc_insert<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq*const&>
              ((vector<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq*,std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq*>>
                *)this,__position,&local_8);
  }
  else {
    *__position._M_current = s;
    pppPVar1 = &(this->_nodes).
                super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return;
}

Assistant:

void append(PSNodesSeq *s) { _nodes.push_back(s); }